

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxerutil.cc
# Opt level: O0

uint64 mkvmuxer::EbmlMasterElementSize(uint64 type,uint64 value)

{
  int32 iVar1;
  int32 iVar2;
  uint64 in_RSI;
  uint64 in_RDI;
  int32 ebml_size;
  
  iVar1 = GetUIntSize(in_RDI);
  iVar2 = GetCodedUIntSize(in_RSI);
  return (long)(iVar2 + iVar1);
}

Assistant:

uint64 EbmlMasterElementSize(uint64 type, uint64 value) {
  // Size of EBML ID
  int32 ebml_size = GetUIntSize(type);

  // Datasize
  ebml_size += GetCodedUIntSize(value);

  return ebml_size;
}